

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDarExtWin(Abc_Ntk_t *pNtk,int nObjId,int nDist,int fVerbose)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  if (nObjId == -1) {
    pAVar2 = p;
    pObj = Saig_ManFindPivot(p);
    Abc_Print((int)pAVar2,"Selected object %d as a window pivot.\n",(ulong)(uint)pObj->Id);
LAB_00275f5c:
    pAVar2 = Saig_ManWindowExtract(p,pObj,nDist);
    Aig_ManStop(p);
    if (pAVar2 == (Aig_Man_t *)0x0) {
      pAVar3 = (Abc_Ntk_t *)0x0;
    }
    else {
      pAVar3 = Abc_NtkFromAigPhase(pAVar2);
      pcVar4 = Extra_UtilStrsav(pNtk->pName);
      pAVar3->pName = pcVar4;
      pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
      pAVar3->pSpec = pcVar4;
      Aig_ManStop(pAVar2);
    }
  }
  else {
    if (p->vObjs->nSize <= nObjId) {
      Aig_ManStop(p);
      Abc_Print((int)p,"The ID is too large.\n");
      return (Abc_Ntk_t *)0x0;
    }
    pObj = Aig_ManObj(p,nObjId);
    if (pObj == (Aig_Obj_t *)0x0) {
      Aig_ManStop(p);
      iVar1 = (int)p;
      pcVar4 = "Object with ID %d does not exist.\n";
    }
    else {
      iVar1 = Saig_ObjIsLo(p,pObj);
      if ((iVar1 != 0) || (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) goto LAB_00275f5c;
      Aig_ManStop(p);
      iVar1 = (int)p;
      pcVar4 = "Object with ID %d is not a node or reg output.\n";
    }
    pAVar3 = (Abc_Ntk_t *)0x0;
    Abc_Print(iVar1,pcVar4,(ulong)(uint)nObjId);
  }
  return pAVar3;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarExtWin( Abc_Ntk_t * pNtk, int nObjId, int nDist, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan1, * pMan;
    Aig_Obj_t * pObj;
    pMan1 = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan1 == NULL )
        return NULL;
    if ( nObjId == -1 )
    {
        pObj = Saig_ManFindPivot( pMan1 );
        Abc_Print( 1, "Selected object %d as a window pivot.\n", pObj->Id );
    }
    else
    {
        if ( nObjId >= Aig_ManObjNumMax(pMan1) )
        {
            Aig_ManStop( pMan1 );
            Abc_Print( 1, "The ID is too large.\n" );
            return NULL;
        }
        pObj = Aig_ManObj( pMan1, nObjId );
        if ( pObj == NULL )
        {
            Aig_ManStop( pMan1 );
            Abc_Print( 1, "Object with ID %d does not exist.\n", nObjId );
            return NULL;
        }
        if ( !Saig_ObjIsLo(pMan1, pObj) && !Aig_ObjIsNode(pObj) )
        {
            Aig_ManStop( pMan1 );
            Abc_Print( 1, "Object with ID %d is not a node or reg output.\n", nObjId );
            return NULL;
        }
    }
    pMan = Saig_ManWindowExtract( pMan1, pObj, nDist );
    Aig_ManStop( pMan1 );
    if ( pMan == NULL )
        return NULL;
    pNtkAig = Abc_NtkFromAigPhase( pMan );
    pNtkAig->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkAig->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Aig_ManStop( pMan );
    return pNtkAig;
}